

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHelpers.hpp
# Opt level: O0

double * callocArrayType<double>(size_t length)

{
  bad_alloc *this;
  undefined8 uVar1;
  size_t in_RDI;
  double *out;
  
  this = (bad_alloc *)calloc(in_RDI,8);
  if (this == (bad_alloc *)0x0) {
    uVar1 = __cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(this);
    __cxa_throw(uVar1,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  return (double *)this;
}

Assistant:

T *callocArrayType(const size_t length)
{
    auto out = (T *)std::calloc(length, sizeof(T));
    if (out == nullptr) throw std::bad_alloc();
    return out;
}